

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.h
# Opt level: O1

void __thiscall
KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt>::anyGreater
          (KDTree<YaoMST::PointPair,_2,_YaoMST::NewAt> *this,PointPair *pt,PointPair *l,PointPair *r
          )

{
  PointPair *pPVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  PointPair *pPVar5;
  long lVar6;
  bool bVar7;
  
  do {
    if (r <= l) {
      return;
    }
    pPVar1 = l + ((long)r - (long)l) / 0x50;
    pPVar5 = this->first;
    lVar6 = 2;
    do {
      dVar2 = (&(pPVar1->oPoint).x)[lVar6];
      dVar3 = (&(pt->oPoint).x)[lVar6];
      if (dVar2 < dVar3) break;
      bVar7 = lVar6 == 2;
      lVar6 = lVar6 + 1;
    } while (bVar7);
    if (dVar3 <= dVar2) {
      this->found = true;
      return;
    }
    anyGreater(this,pt,pPVar1 + 1,r);
    if (this->found != false) {
      return;
    }
    iVar4 = *(int *)((long)(this->split).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start +
                    ((long)pPVar1 - (long)pPVar5 >> 1) * -0x3333333333333333);
    r = pPVar1;
    if ((&(pPVar1->nPoint).x)[iVar4] < (&(pt->nPoint).x)[iVar4]) {
      return;
    }
  } while( true );
}

Assistant:

void anyGreater(const Point &pt, Point *l, Point *r)
	{
		if (l >= r) return;
		auto mid = l + (r - l) / 2;
		auto midIndex = mid - first;
		bool check = true;
		for (int d = 0; d < K && check; ++d)
			check &= coordinate(*mid, d) >= coordinate(pt, d);
		if (check)
			return void(found = true);
		anyGreater(pt, mid + 1, r);
		if (!found && coordinate(pt, split[midIndex]) <= coordinate(*mid, split[midIndex]))
			anyGreater(pt, l, mid);
	}